

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

StringRef __thiscall
llvm::yaml::ScalarNode::unescapeDoubleQuoted
          (ScalarNode *this,StringRef UnquotedValue,size_type i,SmallVectorImpl<char> *Storage)

{
  char cVar1;
  type tVar2;
  char *pcVar3;
  ulong uVar4;
  uint32_t UnicodeScalarValue_00;
  bool bVar5;
  StringRef Chars;
  StringRef SVar6;
  ulong uStack_a0;
  StringRef local_98;
  Token local_88;
  uint UnicodeScalarValue;
  ScalarNode *local_38;
  
  local_98.Length = UnquotedValue.Length;
  local_98.Data = UnquotedValue.Data;
  (Storage->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_38 = this;
  SmallVectorImpl<char>::reserve(Storage,local_98.Length);
  while (i != 0xffffffffffffffff) {
    SmallVectorImpl<char>::insert<char_const*,void>
              (Storage,(iterator)
                       ((ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               Size +
                       (long)(Storage->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX),local_98.Data,local_98.Data + i);
    uVar4 = i;
    if (local_98.Length < i) {
      uVar4 = local_98.Length;
    }
    local_98.Data = local_98.Data + uVar4;
    if (local_98.Length <= i) {
      local_98.Length = local_98.Length - uVar4;
      __assert_fail("!UnquotedValue.empty() && \"Can\'t be empty!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                    ,0x785,
                    "StringRef llvm::yaml::ScalarNode::unescapeDoubleQuoted(StringRef, StringRef::size_type, SmallVectorImpl<char> &) const"
                   );
    }
    local_98.Length = local_98.Length - uVar4;
    cVar1 = StringRef::operator[](&local_98,0);
    if ((cVar1 == '\r') || (cVar1 == '\n')) {
      local_88.Kind._0_1_ = 10;
      SmallVectorTemplateBase<char,_true>::push_back
                (&Storage->super_SmallVectorTemplateBase<char,_true>,(char *)&local_88);
      if ((1 < local_98.Length) &&
         ((cVar1 = StringRef::operator[](&local_98,1), cVar1 == '\r' ||
          (cVar1 = StringRef::operator[](&local_98,1), cVar1 == '\n')))) {
        bVar5 = local_98.Length != 0;
        local_98.Length = local_98.Length - bVar5;
        local_98.Data = local_98.Data + bVar5;
      }
      goto LAB_00175a41;
    }
    if (local_98.Length == 1) goto LAB_00175a59;
    bVar5 = local_98.Length != 0;
    local_98.Length = local_98.Length - bVar5;
    local_98.Data = local_98.Data + bVar5;
    cVar1 = StringRef::operator[](&local_98,0);
    switch(cVar1) {
    case '\\':
      local_88.Kind._0_1_ = 0x5c;
      break;
    case ']':
    case '^':
    case '`':
    case 'c':
    case 'd':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'o':
    case 'p':
    case 'q':
    case 's':
    case 'w':
switchD_00175824_caseD_5d:
      local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
      local_88.Value._M_dataplus._M_p = (pointer)&local_88.Value.field_2;
      local_88.Value._M_string_length = 0;
      local_88.Value.field_2._M_local_buf[0] = '\0';
      local_88.Range.Data = local_98.Data;
      local_88.Range.Length = 1;
      Twine::Twine((Twine *)&UnicodeScalarValue,"Unrecognized escape code!");
      Node::setError(&local_38->super_Node,(Twine *)&UnicodeScalarValue,&local_88);
      std::__cxx11::string::_M_dispose();
      pcVar3 = "";
      uVar4 = 0;
      goto LAB_00175af0;
    case '_':
      UnicodeScalarValue_00 = 0xa0;
      goto LAB_001759ae;
    case 'a':
      local_88.Kind._0_1_ = 7;
      break;
    case 'b':
      local_88.Kind._0_1_ = 8;
      break;
    case 'e':
      local_88.Kind._0_1_ = 0x1b;
      break;
    case 'f':
      local_88.Kind._0_1_ = 0xc;
      break;
    case 'n':
      local_88.Kind._0_1_ = 10;
      break;
    case 'r':
      local_88.Kind._0_1_ = 0xd;
      break;
    case 't':
switchD_00175824_caseD_74:
      local_88.Kind._0_1_ = 9;
      break;
    case 'u':
      if (4 < local_98.Length) {
        local_88._0_8_ = local_98.Data + 1;
        local_88.Range.Data = (char *)0x4;
        tVar2 = StringRef::getAsInteger<unsigned_int>
                          ((StringRef *)&local_88,0x10,&UnicodeScalarValue);
        if (tVar2) {
          UnicodeScalarValue = 0xfffd;
        }
        encodeUTF8(UnicodeScalarValue,Storage);
        bVar5 = local_98.Length < 4;
        uStack_a0 = 4;
LAB_00175aba:
        if (bVar5) {
          uStack_a0 = local_98.Length;
        }
LAB_00175abf:
        local_98.Length = local_98.Length - uStack_a0;
        local_98.Data = local_98.Data + uStack_a0;
      }
      goto LAB_00175a41;
    case 'v':
      local_88.Kind._0_1_ = 0xb;
      break;
    case 'x':
      if (2 < local_98.Length) {
        local_88._0_8_ = local_98.Data + 1;
        local_88.Range.Data = (char *)0x2;
        tVar2 = StringRef::getAsInteger<unsigned_int>
                          ((StringRef *)&local_88,0x10,&UnicodeScalarValue);
        if (tVar2) {
          UnicodeScalarValue = 0xfffd;
        }
        encodeUTF8(UnicodeScalarValue,Storage);
        bVar5 = local_98.Length < 2;
        uStack_a0 = 2;
        goto LAB_00175aba;
      }
      goto LAB_00175a41;
    default:
      switch(cVar1) {
      case 'L':
        UnicodeScalarValue_00 = 0x2028;
        break;
      case 'M':
      case 'O':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
        goto switchD_00175824_caseD_5d;
      case 'N':
        UnicodeScalarValue_00 = 0x85;
        break;
      case 'P':
        UnicodeScalarValue_00 = 0x2029;
        break;
      case 'U':
        if (8 < local_98.Length) {
          local_88._0_8_ = local_98.Data + 1;
          local_88.Range.Data = (char *)0x8;
          tVar2 = StringRef::getAsInteger<unsigned_int>
                            ((StringRef *)&local_88,0x10,&UnicodeScalarValue);
          if (tVar2) {
            UnicodeScalarValue = 0xfffd;
          }
          encodeUTF8(UnicodeScalarValue,Storage);
          bVar5 = local_98.Length < 8;
          uStack_a0 = 8;
          goto LAB_00175aba;
        }
        goto LAB_00175a41;
      default:
        if (cVar1 == '\t') goto switchD_00175824_caseD_74;
        if (cVar1 != '\n') {
          if (cVar1 == '0') {
            local_88._0_8_ = (ulong)(uint7)local_88._1_7_ << 8;
          }
          else if (cVar1 == ' ') {
            local_88.Kind._0_1_ = 0x20;
          }
          else if (cVar1 == '\"') {
            local_88.Kind._0_1_ = 0x22;
          }
          else {
            if (cVar1 != '/') {
              if (cVar1 != '\r') goto switchD_00175824_caseD_5d;
              goto LAB_00175873;
            }
            local_88.Kind._0_1_ = 0x2f;
          }
          goto LAB_00175a31;
        }
LAB_00175873:
        if ((local_98.Length < 2) ||
           ((cVar1 = StringRef::operator[](&local_98,1), cVar1 != '\r' &&
            (cVar1 = StringRef::operator[](&local_98,1), cVar1 != '\n')))) goto LAB_00175a41;
        uStack_a0 = (ulong)(local_98.Length != 0);
        goto LAB_00175abf;
      }
LAB_001759ae:
      encodeUTF8(UnicodeScalarValue_00,Storage);
      goto LAB_00175a41;
    }
LAB_00175a31:
    SmallVectorTemplateBase<char,_true>::push_back
              (&Storage->super_SmallVectorTemplateBase<char,_true>,(char *)&local_88);
LAB_00175a41:
    bVar5 = local_98.Length != 0;
    local_98.Length = local_98.Length - bVar5;
    local_98.Data = local_98.Data + bVar5;
LAB_00175a59:
    Chars.Length = 3;
    Chars.Data = "\\\r\n";
    i = StringRef::find_first_of(&local_98,Chars,0);
  }
  SmallVectorImpl<char>::insert<char_const*,void>
            (Storage,(iterator)
                     ((ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
                     + (long)(Storage->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX),local_98.Data,local_98.Data + local_98.Length);
  pcVar3 = (char *)(Storage->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar4 = (ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
LAB_00175af0:
  SVar6.Length = uVar4;
  SVar6.Data = pcVar3;
  return SVar6;
}

Assistant:

StringRef ScalarNode::unescapeDoubleQuoted( StringRef UnquotedValue
                                          , StringRef::size_type i
                                          , SmallVectorImpl<char> &Storage)
                                          const {
  // Use Storage to build proper value.
  Storage.clear();
  Storage.reserve(UnquotedValue.size());
  for (; i != StringRef::npos; i = UnquotedValue.find_first_of("\\\r\n")) {
    // Insert all previous chars into Storage.
    StringRef Valid(UnquotedValue.begin(), i);
    Storage.insert(Storage.end(), Valid.begin(), Valid.end());
    // Chop off inserted chars.
    UnquotedValue = UnquotedValue.substr(i);

    assert(!UnquotedValue.empty() && "Can't be empty!");

    // Parse escape or line break.
    switch (UnquotedValue[0]) {
    case '\r':
    case '\n':
      Storage.push_back('\n');
      if (   UnquotedValue.size() > 1
          && (UnquotedValue[1] == '\r' || UnquotedValue[1] == '\n'))
        UnquotedValue = UnquotedValue.substr(1);
      UnquotedValue = UnquotedValue.substr(1);
      break;
    default:
      if (UnquotedValue.size() == 1)
        // TODO: Report error.
        break;
      UnquotedValue = UnquotedValue.substr(1);
      switch (UnquotedValue[0]) {
      default: {
          Token T;
          T.Range = StringRef(UnquotedValue.begin(), 1);
          setError("Unrecognized escape code!", T);
          return "";
        }
      case '\r':
      case '\n':
        // Remove the new line.
        if (   UnquotedValue.size() > 1
            && (UnquotedValue[1] == '\r' || UnquotedValue[1] == '\n'))
          UnquotedValue = UnquotedValue.substr(1);
        // If this was just a single byte newline, it will get skipped
        // below.
        break;
      case '0':
        Storage.push_back(0x00);
        break;
      case 'a':
        Storage.push_back(0x07);
        break;
      case 'b':
        Storage.push_back(0x08);
        break;
      case 't':
      case 0x09:
        Storage.push_back(0x09);
        break;
      case 'n':
        Storage.push_back(0x0A);
        break;
      case 'v':
        Storage.push_back(0x0B);
        break;
      case 'f':
        Storage.push_back(0x0C);
        break;
      case 'r':
        Storage.push_back(0x0D);
        break;
      case 'e':
        Storage.push_back(0x1B);
        break;
      case ' ':
        Storage.push_back(0x20);
        break;
      case '"':
        Storage.push_back(0x22);
        break;
      case '/':
        Storage.push_back(0x2F);
        break;
      case '\\':
        Storage.push_back(0x5C);
        break;
      case 'N':
        encodeUTF8(0x85, Storage);
        break;
      case '_':
        encodeUTF8(0xA0, Storage);
        break;
      case 'L':
        encodeUTF8(0x2028, Storage);
        break;
      case 'P':
        encodeUTF8(0x2029, Storage);
        break;
      case 'x': {
          if (UnquotedValue.size() < 3)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 2).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(2);
          break;
        }
      case 'u': {
          if (UnquotedValue.size() < 5)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 4).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(4);
          break;
        }
      case 'U': {
          if (UnquotedValue.size() < 9)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 8).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(8);
          break;
        }
      }
      UnquotedValue = UnquotedValue.substr(1);
    }
  }
  Storage.insert(Storage.end(), UnquotedValue.begin(), UnquotedValue.end());
  return StringRef(Storage.begin(), Storage.size());
}